

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzeqnarray.cpp
# Opt level: O3

void __thiscall
TPZEqnArray<std::complex<float>_>::EqnForward
          (TPZEqnArray<std::complex<float>_> *this,TPZFMatrix<std::complex<float>_> *F,
          DecomposeType dec)

{
  float fVar1;
  uint uVar2;
  complex<float> *pcVar3;
  complex<float> *pcVar4;
  _ComplexT _Var5;
  ostream *poVar6;
  long *plVar7;
  int *piVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  undefined8 uVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined8 local_78;
  
  if (this->fSymmetric == EIsSymmetric) {
    uVar9 = (ulong)(uint)this->fNumEq;
    if (0 < this->fNumEq) {
      uVar14 = 0;
      do {
        uVar2 = (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore[uVar14];
        lVar13 = (long)(int)uVar2;
        pcVar3 = (this->fEqValues).super_TPZManVector<std::complex<float>,_1000>.
                 super_TPZVec<std::complex<float>_>.fStore;
        if (((*(float *)&pcVar3[lVar13]._M_value == 0.0) &&
            (fVar18 = *(float *)((long)&pcVar3[lVar13]._M_value + 4), fVar18 == 0.0)) &&
           (!NAN(fVar18))) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Diagonal Value = 0 >> Aborting on Index = ",0x2a);
          poVar6 = (ostream *)std::ostream::operator<<(&std::cout,uVar2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," Equation = ",0xc);
          plVar7 = (long *)std::ostream::operator<<(poVar6,(int)uVar14);
          std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
          std::ostream::put((char)plVar7);
          std::ostream::flush();
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Frontal/tpzeqnarray.cpp"
                     ,0x8b);
        }
        if (uVar14 == (int)uVar9 - 1) {
          iVar12 = (int)(this->fEqValues).super_TPZManVector<std::complex<float>,_1000>.
                        super_TPZVec<std::complex<float>_>.fNElements;
        }
        else {
          iVar12 = (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore
                   [uVar14 + 1];
        }
        piVar8 = (this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore;
        lVar15 = (F->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
        lVar10 = (F->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol;
        if ((dec & ~ELUPivot) == ELU) {
          pcVar3 = (this->fEqValues).super_TPZManVector<std::complex<float>,_1000>.
                   super_TPZVec<std::complex<float>_>.fStore;
          lVar11 = (long)piVar8[lVar13];
          if ((lVar10 < 1 || lVar11 < 0) || lVar15 <= lVar11) {
            TPZFMatrix<std::complex<float>_>::Error
                      ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          pcVar4 = F->fElem;
          _Var5 = __divsc3((int)pcVar4[lVar11]._M_value,
                           *(undefined4 *)((long)&pcVar4[lVar11]._M_value + 4),
                           (int)pcVar3[lVar13]._M_value,
                           *(undefined4 *)((long)&pcVar3[lVar13]._M_value + 4));
          pcVar4[lVar11]._M_value = _Var5;
          piVar8 = (this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore;
          lVar15 = (F->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
          lVar10 = (F->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol;
        }
        lVar11 = (long)piVar8[lVar13];
        if (((lVar11 < 0) || (lVar15 <= lVar11)) || (lVar10 < 1)) {
          TPZFMatrix<std::complex<float>_>::Error
                    ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar15 = lVar13 + 1;
        if ((int)lVar15 < iVar12) {
          _Var5 = F->fElem[lVar11]._M_value;
          fVar18 = (float)_Var5;
          fVar19 = (float)(_Var5 >> 0x20);
          iVar12 = ~uVar2 + iVar12;
          do {
            pcVar3 = (this->fEqValues).super_TPZManVector<std::complex<float>,_1000>.
                     super_TPZVec<std::complex<float>_>.fStore;
            fVar20 = *(float *)&pcVar3[lVar15]._M_value;
            fVar1 = *(float *)((long)&pcVar3[lVar15]._M_value + 4);
            fVar17 = fVar20 * fVar18 - fVar1 * fVar19;
            fVar20 = fVar20 * fVar19 + fVar1 * fVar18;
            uVar16 = CONCAT44(fVar20,fVar17);
            if ((NAN(fVar17)) && (uVar16 = CONCAT44(fVar20,fVar17), NAN(fVar20))) {
              uVar16 = __mulsc3(fVar18,CONCAT44(fVar19,fVar19));
            }
            lVar10 = (long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore
                           [lVar15];
            if (((lVar10 < 0) ||
                ((F->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow <= lVar10)) ||
               ((F->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<std::complex<float>_>::Error
                        ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            _Var5 = F->fElem[lVar10]._M_value;
            F->fElem[lVar10]._M_value =
                 CONCAT44((float)(_Var5 >> 0x20) - (float)((ulong)uVar16 >> 0x20),
                          (float)_Var5 - (float)uVar16);
            lVar15 = lVar15 + 1;
            iVar12 = iVar12 + -1;
          } while (iVar12 != 0);
        }
        if (dec == ELDLt) {
          pcVar3 = (this->fEqValues).super_TPZManVector<std::complex<float>,_1000>.
                   super_TPZVec<std::complex<float>_>.fStore;
          lVar15 = (long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore
                         [lVar13];
          if (((lVar15 < 0) ||
              ((F->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow <= lVar15)) ||
             ((F->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<std::complex<float>_>::Error
                      ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          pcVar4 = F->fElem;
          _Var5 = __divsc3((int)pcVar4[lVar15]._M_value,
                           *(undefined4 *)((long)&pcVar4[lVar15]._M_value + 4),
                           (int)pcVar3[lVar13]._M_value,
                           *(undefined4 *)((long)&pcVar3[lVar13]._M_value + 4));
          pcVar4[lVar15]._M_value = _Var5;
        }
        uVar14 = uVar14 + 1;
        uVar9 = (ulong)this->fNumEq;
      } while ((long)uVar14 < (long)uVar9);
    }
  }
  else if ((this->fSymmetric == EIsNonSymmetric) && (iVar12 = this->fNumEq, 1 < iVar12)) {
    uVar9 = 1;
    do {
      uVar2 = (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore[uVar9];
      lVar13 = (long)(int)uVar2;
      pcVar3 = (this->fEqValues).super_TPZManVector<std::complex<float>,_1000>.
               super_TPZVec<std::complex<float>_>.fStore;
      if (((*(float *)&pcVar3[lVar13]._M_value == 0.0) &&
          (fVar18 = *(float *)((long)&pcVar3[lVar13]._M_value + 4), fVar18 == 0.0)) &&
         (!NAN(fVar18))) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Diagonal Value = 0 >> Aborting on Index = ",0x2a);
        poVar6 = (ostream *)std::ostream::operator<<(&std::cout,uVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," Equation = ",0xc);
        plVar7 = (long *)std::ostream::operator<<(poVar6,(int)uVar9);
        std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
        std::ostream::put((char)plVar7);
        std::ostream::flush();
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Frontal/tpzeqnarray.cpp"
                   ,0xa5);
      }
      if (uVar9 == iVar12 - 1) {
        iVar12 = (int)(this->fEqValues).super_TPZManVector<std::complex<float>,_1000>.
                      super_TPZVec<std::complex<float>_>.fNElements;
      }
      else {
        iVar12 = (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore[uVar9 + 1];
      }
      piVar8 = (this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore;
      lVar15 = (F->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
      lVar10 = (F->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol;
      if ((dec & ~ELUPivot) == ELU) {
        pcVar3 = (this->fEqValues).super_TPZManVector<std::complex<float>,_1000>.
                 super_TPZVec<std::complex<float>_>.fStore;
        lVar11 = (long)piVar8[lVar13];
        if ((lVar10 < 1 || lVar11 < 0) || lVar15 <= lVar11) {
          TPZFMatrix<std::complex<float>_>::Error
                    ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        pcVar4 = F->fElem;
        _Var5 = __divsc3((int)pcVar4[lVar11]._M_value,
                         *(undefined4 *)((long)&pcVar4[lVar11]._M_value + 4),
                         (int)pcVar3[lVar13]._M_value,
                         *(undefined4 *)((long)&pcVar3[lVar13]._M_value + 4));
        pcVar4[lVar11]._M_value = _Var5;
        piVar8 = (this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore;
        lVar15 = (F->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
        lVar10 = (F->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol;
      }
      lVar11 = (long)piVar8[lVar13];
      if (((lVar11 < 0) || (lVar15 <= lVar11)) || (lVar10 < 1)) {
        TPZFMatrix<std::complex<float>_>::Error
                  ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar13 = lVar13 + 1;
      if ((int)lVar13 < iVar12) {
        _Var5 = F->fElem[lVar11]._M_value;
        fVar18 = (float)_Var5;
        fVar19 = (float)(_Var5 >> 0x20);
        local_78 = CONCAT44(fVar19,fVar19);
        iVar12 = ~uVar2 + iVar12;
        do {
          pcVar3 = (this->fEqValues).super_TPZManVector<std::complex<float>,_1000>.
                   super_TPZVec<std::complex<float>_>.fStore;
          fVar20 = *(float *)&pcVar3[lVar13]._M_value;
          fVar1 = *(float *)((long)&pcVar3[lVar13]._M_value + 4);
          fVar17 = fVar20 * fVar18 - fVar1 * fVar19;
          fVar20 = fVar20 * fVar19 + fVar1 * fVar18;
          uVar16 = CONCAT44(fVar20,fVar17);
          if ((NAN(fVar17)) && (uVar16 = CONCAT44(fVar20,fVar17), NAN(fVar20))) {
            uVar16 = __mulsc3(fVar18,local_78);
          }
          lVar15 = (long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore
                         [lVar13];
          if (((lVar15 < 0) ||
              ((F->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow <= lVar15)) ||
             ((F->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<std::complex<float>_>::Error
                      ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          _Var5 = F->fElem[lVar15]._M_value;
          F->fElem[lVar15]._M_value =
               CONCAT44((float)(_Var5 >> 0x20) - (float)((ulong)uVar16 >> 0x20),
                        (float)_Var5 - (float)uVar16);
          lVar13 = lVar13 + 1;
          iVar12 = iVar12 + -1;
        } while (iVar12 != 0);
      }
      uVar9 = uVar9 + 2;
      iVar12 = this->fNumEq;
    } while ((int)uVar9 < iVar12);
  }
  return;
}

Assistant:

void TPZEqnArray<TVar>::EqnForward(TPZFMatrix<TVar> & F, DecomposeType dec) {
	int j;
	if(IsSymmetric()==EIsSymmetric){
		
		for(j=0; j<fNumEq; j++) {
			int index = fEqStart[j];
			if(fEqValues[index] == (TVar)0.) {
				cout << "Diagonal Value = 0 >> Aborting on Index = " << index << " Equation = " << j << endl;
				DebugStop();
			}
			int last_term;
			if(j==fNumEq-1){
				last_term=fEqValues.NElements();
			}else last_term = fEqStart[j+1];
			
			/** cholesky e lu */
			if(dec==ECholesky || dec==ELU) {
				F(fIndex[index],0) /= fEqValues[index];
			}
			/** ldlt cholesky lu */
			TVar udiag = F(fIndex[index],0);
			
			int i;
			//+1 ou +2
			for(i = index + 1; i < last_term; i++) F(fIndex[i],0) -= udiag * fEqValues[i];
			/** finalizacao para ldlt */
			if(dec == ELDLt) F(fIndex[index],0) /= fEqValues[index];
		}
	} else if(IsSymmetric()==EIsNonSymmetric) {
		for(j=1; j<fNumEq; j+=2) {
			int index = fEqStart[j];
			
			if(fEqValues[index] == (TVar)0.){
				cout << "Diagonal Value = 0 >> Aborting on Index = " << index << " Equation = " << j << endl;
				DebugStop();
			}          
			
			int last_term;
			if(j==fNumEq-1){
				last_term=fEqValues.NElements();
			}else last_term = fEqStart[j+1];
			//if(fEqStart.NElements()
			
			
			/** cholesky e lu */
			if(dec==ECholesky || dec==ELU) {
				F(fIndex[index],0) /= fEqValues[index];
			}
			/** ldlt cholesky lu */
			TVar udiag = F(fIndex[index],0);
			
			
			int i;
			for(i = index + 1; i < last_term; i++) F(fIndex[i],0) -= udiag * fEqValues[i];
		}
	}
}